

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

optional<double> __thiscall RPCHelpMan::MaybeArg<double>(RPCHelpMan *this,string_view key)

{
  long lVar1;
  size_t i;
  long in_FS_OFFSET;
  _Optional_base<double,_true,_true> _Var2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  i = GetParamIndex(this,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    _Var2._M_payload.super__Optional_payload_base<double> =
         (_Optional_payload<double,_true,_true,_true>)ArgValue<std::optional<double>>(this,i);
    return (_Optional_base<double,_true,_true>)
           (_Optional_base<double,_true,_true>)_Var2._M_payload.super__Optional_payload_base<double>
    ;
  }
  __stack_chk_fail();
}

Assistant:

auto MaybeArg(std::string_view key) const
    {
        auto i{GetParamIndex(key)};
        // Return optional argument (without default).
        if constexpr (std::is_integral_v<R> || std::is_floating_point_v<R>) {
            // Return numbers by value, wrapped in optional.
            return ArgValue<std::optional<R>>(i);
        } else {
            // Return other types by pointer.
            return ArgValue<const R*>(i);
        }
    }